

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Accuracy::TextureCubeFilteringCase::~TextureCubeFilteringCase
          (TextureCubeFilteringCase *this)

{
  pointer ppTVar1;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeFilteringCase_0076c458;
  deinit(this);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&this->m_renderer);
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->m_textures).
                                  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_filenames);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TextureCubeFilteringCase::~TextureCubeFilteringCase (void)
{
	deinit();
}